

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateArenaDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  string *value;
  int iVar1;
  pointer ppFVar2;
  FieldGenerator *pFVar3;
  Descriptor *pDVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  char *text;
  long lVar9;
  long lVar10;
  
  value = &this->classname_;
  io::Printer::Print(printer,"void $classname$::ArenaDtor(void* object) {\n","classname",value);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "$classname$* _this = reinterpret_cast< $classname$* >(object);\n(void)_this;\n"
                     ,"classname",value);
  ppFVar2 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish == ppFVar2) {
    bVar6 = false;
    bVar7 = false;
  }
  else {
    uVar8 = 0;
    bVar6 = false;
    bVar7 = false;
    do {
      pFVar3 = FieldGeneratorMap::get(&this->field_generators_,ppFVar2[uVar8]);
      iVar1 = (*pFVar3->_vptr_FieldGenerator[0x10])(pFVar3,printer);
      if ((char)iVar1 != '\0') {
        bVar6 = true;
        bVar7 = true;
      }
      uVar8 = uVar8 + 1;
      ppFVar2 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(this->optimized_order_).
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2 >> 3))
    ;
  }
  pDVar4 = this->descriptor_;
  if (0 < *(int *)(pDVar4 + 0x38)) {
    lVar5 = 0;
    do {
      if (0 < *(int *)(*(long *)(pDVar4 + 0x40) + 0x1c + lVar5 * 0x30)) {
        lVar10 = *(long *)(pDVar4 + 0x40) + lVar5 * 0x30;
        lVar9 = 0;
        bVar7 = bVar6;
        do {
          pFVar3 = FieldGeneratorMap::get
                             (&this->field_generators_,
                              *(FieldDescriptor **)(*(long *)(lVar10 + 0x20) + lVar9 * 8));
          iVar1 = (*pFVar3->_vptr_FieldGenerator[0x10])(pFVar3,printer);
          bVar6 = true;
          if ((char)iVar1 == '\0') {
            bVar6 = bVar7;
          }
          bVar7 = bVar6;
          lVar9 = lVar9 + 1;
          bVar6 = bVar7;
        } while (lVar9 < *(int *)(lVar10 + 0x1c));
      }
      lVar5 = lVar5 + 1;
      pDVar4 = this->descriptor_;
    } while (lVar5 < *(int *)(pDVar4 + 0x38));
  }
  if (this->num_weak_fields_ != 0) {
    io::Printer::Print(printer,"_this->_weak_field_map_.ClearAll();\n");
    bVar7 = true;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  text = "void $classname$::RegisterArenaDtor(::google::protobuf::Arena* arena) {\n}\n";
  if (bVar7) {
    text = 
    "inline void $classname$::RegisterArenaDtor(::google::protobuf::Arena* arena) {\n  if (arena != NULL) {\n    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n  }\n}\n"
    ;
  }
  io::Printer::Print(printer,text,"classname",value);
  return;
}

Assistant:

void MessageGenerator::
GenerateArenaDestructorCode(io::Printer* printer) {
  // Generate the ArenaDtor() method. Track whether any fields actually produced
  // code that needs to be called.
  printer->Print(
      "void $classname$::ArenaDtor(void* object) {\n",
      "classname", classname_);
  printer->Indent();

  // This code is placed inside a static method, rather than an ordinary one,
  // since that simplifies Arena's destructor list (ordinary function pointers
  // rather than member function pointers). _this is the object being
  // destructed.
  printer->Print(
      "$classname$* _this = reinterpret_cast< $classname$* >(object);\n"
      // avoid an "unused variable" warning in case no fields have dtor code.
      "(void)_this;\n",
      "classname", classname_);

  bool need_registration = false;
  // Process non-oneof fields first.
  for (int i = 0; i < optimized_order_.size(); i++) {
    const FieldDescriptor* field = optimized_order_[i];
    if (field_generators_.get(field)
                         .GenerateArenaDestructorCode(printer)) {
      need_registration = true;
    }
  }

  // Process oneof fields.
  //
  // Note:  As of 10/5/2016, GenerateArenaDestructorCode does not emit anything
  // and returns false for oneof fields.
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = descriptor_->oneof_decl(i);

    for (int j = 0; j < oneof->field_count(); j++) {
      const FieldDescriptor* field = oneof->field(j);
      if (field_generators_.get(field)
                           .GenerateArenaDestructorCode(printer)) {
        need_registration = true;
      }
    }
  }
  if (num_weak_fields_) {
    // _this is the object being destructed (we are inside a static method
    // here).
    printer->Print("_this->_weak_field_map_.ClearAll();\n");
    need_registration = true;
  }

  printer->Outdent();
  printer->Print(
      "}\n");

  if (need_registration) {
    printer->Print(
        "inline void $classname$::RegisterArenaDtor(::google::protobuf::Arena* arena) {\n"
        "  if (arena != NULL) {\n"
        "    arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);\n"
        "  }\n"
        "}\n",
        "classname", classname_);
  } else {
    printer->Print(
        "void $classname$::RegisterArenaDtor(::google::protobuf::Arena* arena) {\n"
        "}\n",
        "classname", classname_);
  }
}